

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# daily_file_sink.h
# Opt level: O0

filename_t *
spdlog::sinks::daily_filename_calculator::calc_filename
          (filename_t *__return_storage_ptr__,filename_t *filename,tm *now_tm)

{
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *buf;
  int local_2e4;
  int local_2e0;
  allocator<char> local_2d9;
  undefined1 local_2d8 [8];
  type w;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  undefined1 local_60 [8];
  filename_t ext;
  filename_t basename;
  tm *now_tm_local;
  filename_t *filename_local;
  
  std::__cxx11::string::string((string *)(ext.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_60);
  details::file_helper::split_by_extenstion(&local_a0,filename);
  std::tie<std::__cxx11::string,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(w.store_ + 0x1f0)
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)&ext.field_2 + 8));
  std::tuple<std::__cxx11::string&,std::__cxx11::string&>::operator=
            ((tuple<std::__cxx11::string&,std::__cxx11::string&> *)(w.store_ + 0x1f0),&local_a0);
  std::
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~tuple(&local_a0);
  std::allocator<char>::allocator();
  ::fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_2d8,&local_2d9);
  std::allocator<char>::~allocator(&local_2d9);
  local_2e0 = now_tm->tm_year + 0x76c;
  local_2e4 = now_tm->tm_mon + 1;
  ::fmt::v5::format_to<char[26],std::__cxx11::string,int,int,int,std::__cxx11::string,500ul,char>
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_2d8,
             (char (*) [26])"{}_{:04d}-{:02d}-{:02d}{}",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&ext.field_2 + 8),&local_2e0,&local_2e4,&now_tm->tm_mday,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  ::fmt::v5::to_string<char,500ul>(__return_storage_ptr__,(v5 *)local_2d8,buf);
  ::fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_2d8);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(ext.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

static filename_t calc_filename(const filename_t &filename, const tm &now_tm)
    {
        filename_t basename, ext;
        std::tie(basename, ext) = details::file_helper::split_by_extenstion(filename);
        std::conditional<std::is_same<filename_t::value_type, char>::value, fmt::memory_buffer, fmt::wmemory_buffer>::type w;
        fmt::format_to(
            w, SPDLOG_FILENAME_T("{}_{:04d}-{:02d}-{:02d}{}"), basename, now_tm.tm_year + 1900, now_tm.tm_mon + 1, now_tm.tm_mday, ext);
        return fmt::to_string(w);
    }